

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_7,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  long lVar2;
  Vector<float,_3> res;
  Type in0;
  Type in1;
  float afStack_a8 [6];
  undefined8 local_90;
  int local_88 [4];
  undefined8 local_78;
  undefined4 local_70;
  Matrix<float,_4,_2> local_68;
  Matrix<float,_2,_2> local_48;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_1c;
  undefined4 local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_68.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_68.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_68.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_68.m_data.m_data[0].m_data[0] = -0.6;
    local_68.m_data.m_data[0].m_data[1] = -0.6;
    local_68.m_data.m_data[0].m_data[2] = -0.2;
    local_68.m_data.m_data[0].m_data[3] = -0.1;
    local_68.m_data.m_data[1].m_data[0] = -1.1;
    local_68.m_data.m_data[1].m_data[1] = -0.6;
    local_68.m_data.m_data[1].m_data[2] = -0.6;
    local_68.m_data.m_data[1].m_data[3] = -0.1;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_48.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    local_48.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_48.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_48.m_data.m_data[0].m_data[0] = 0.8;
    local_48.m_data.m_data[0].m_data[1] = 0.5;
    local_48.m_data.m_data[1].m_data[0] = 0.1;
    local_48.m_data.m_data[1].m_data[1] = -0.9;
  }
  tcu::operator*(&local_68,&local_48);
  local_90 = local_30;
  local_88[0] = local_28;
  local_78 = local_1c;
  local_70 = local_14;
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  afStack_a8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_a8[lVar2 + 2] =
         *(float *)((long)&local_90 + lVar2 * 4) + *(float *)((long)&local_78 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar2 * 4)] = afStack_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}